

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O1

void Mvc_ListDeleteCube_(Mvc_List_t *pList,Mvc_Cube_t *pPrev,Mvc_Cube_t *pCube)

{
  Mvc_List_t *pMVar1;
  
  pMVar1 = (Mvc_List_t *)pPrev;
  if (pPrev == (Mvc_Cube_t *)0x0) {
    pMVar1 = pList;
  }
  pMVar1->pHead = pCube->pNext;
  if (pList->pTail == pCube) {
    if (pCube->pNext != (Mvc_Cube_t *)0x0) {
      __assert_fail("Mvc_CubeReadNext(pCube) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcList.c"
                    ,0x66,"void Mvc_ListDeleteCube_(Mvc_List_t *, Mvc_Cube_t *, Mvc_Cube_t *)");
    }
    pList->pTail = pPrev;
  }
  pList->nItems = pList->nItems + -1;
  return;
}

Assistant:

void Mvc_ListDeleteCube_( Mvc_List_t * pList, Mvc_Cube_t * pPrev, Mvc_Cube_t * pCube )
{
    if ( pPrev == NULL ) // deleting the head cube
        pList->pHead = Mvc_CubeReadNext(pCube);
    else
        pPrev->pNext = pCube->pNext;
    if ( pList->pTail == pCube ) // deleting the tail cube
    {
        assert( Mvc_CubeReadNext(pCube) == NULL );
        pList->pTail = pPrev;
    }
    pList->nItems--;
}